

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetInstallNameDirForBuildTree
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmMakefile *pcVar1;
  bool bVar2;
  byte local_132;
  allocator local_f1;
  string local_f0;
  undefined1 local_cc;
  byte local_cb;
  byte local_ca;
  allocator local_c9;
  string local_c8;
  byte local_a3;
  byte local_a2;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  string *local_20;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *dir;
  
  local_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"BUILD_WITH_INSTALL_RPATH",&local_41);
  bVar2 = GetPropertyAsBool(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (bVar2) {
    GetInstallNameDirForInstallTree_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    local_a2 = 0;
    local_a3 = 0;
    local_ca = 0;
    local_cb = 0;
    std::__cxx11::string::string((string *)&local_78,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_79);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_78);
    local_132 = 0;
    if (bVar2) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      local_a2 = 1;
      std::__cxx11::string::string((string *)&local_a0,"CMAKE_SKIP_RPATH",&local_a1);
      local_a3 = 1;
      bVar2 = cmMakefile::IsOn(pcVar1,&local_a0);
      local_132 = 0;
      if (!bVar2) {
        std::allocator<char>::allocator();
        local_ca = 1;
        std::__cxx11::string::string((string *)&local_c8,"SKIP_BUILD_RPATH",&local_c9);
        local_cb = 1;
        bVar2 = GetPropertyAsBool(this,&local_c8);
        local_132 = bVar2 ^ 0xff;
      }
    }
    if ((local_cb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_c8);
    }
    if ((local_ca & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
    if ((local_a3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_a0);
    }
    if ((local_a2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    if ((local_132 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_f1);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    }
    else {
      local_cc = 0;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      bVar2 = MacOSXRpathInstallNameDirDefault(this);
      if (bVar2) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"@rpath");
      }
      else {
        GetDirectory(&local_f0,this,local_20,false);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmGeneratorTarget::GetInstallNameDirForBuildTree(
                                            const std::string& config) const
{
  // If building directly for installation then the build tree install_name
  // is the same as the install tree.
  if(this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"))
    {
    return this->GetInstallNameDirForInstallTree();
    }

  // Use the build tree directory for the target.
  if(this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME") &&
     !this->Makefile->IsOn("CMAKE_SKIP_RPATH") &&
     !this->GetPropertyAsBool("SKIP_BUILD_RPATH"))
    {
    std::string dir;
    if(this->MacOSXRpathInstallNameDirDefault())
      {
      dir = "@rpath";
      }
    else
      {
      dir = this->GetDirectory(config);
      }
    dir += "/";
    return dir;
    }
  else
    {
    return "";
    }
}